

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::Resize(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
         *this)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  bool bVar4;
  uint prime;
  BOOL BVar5;
  hash_t hVar6;
  Recycler *pRVar7;
  undefined4 *puVar8;
  int *__s;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *dst;
  long lVar9;
  ulong dstCount;
  int *piVar10;
  size_t sVar11;
  undefined1 local_70 [8];
  TrackAllocData data;
  int modIndex;
  
  data._36_4_ = 0x4b;
  prime = PrimePolicy::GetPrime(this->count * 2,(int *)&data.field_0x24);
  if ((int)prime <= this->count) {
    Js::Throw::OutOfMemory();
  }
  dstCount = (ulong)(int)prime;
  local_70 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_190cf2;
  data.filename._0_4_ = 0x165;
  data.plusSize = dstCount;
  pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (prime == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
    __s = (int *)&DAT_00000008;
  }
  else {
    sVar11 = 0xffffffffffffffff;
    if (-1 < (int)prime) {
      sVar11 = dstCount * 4;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007ce324;
      *puVar8 = 0;
    }
    __s = (int *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar7,sVar11);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007ce324;
      *puVar8 = 0;
    }
  }
  if (0 < (int)prime) {
    memset(__s,0xff,(ulong)prime << 2);
  }
  local_70 = (undefined1  [8])
             &WeakRefDictionaryEntry<Js::PropertyRecord_const,Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_190cf2;
  data.filename._0_4_ = 0x167;
  data.plusSize = dstCount;
  pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (prime == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
    dst = (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
           *)&DAT_00000008;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dstCount;
    sVar11 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      sVar11 = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007ce324;
      *puVar8 = 0;
    }
    if (sVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar4) goto LAB_007ce324;
      *puVar8 = 0;
    }
    dst = (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
           *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (pRVar7,sVar11);
    if (dst == (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
                *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007ce324;
      *puVar8 = 0;
    }
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(dst->key).ptr + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar9 = lVar9 + 0x18;
    } while (dstCount * 0x18 != lVar9);
  }
  Memory::
  CopyArray<JsUtil::WeakRefDictionaryEntry<Js::PropertyRecord_const,Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyRecord_const>const>,Memory::Recycler>
            (dst,dstCount,(this->entries).ptr,(long)this->count);
  if ((int)prime <= this->count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x169,"(count < newSize)","count < newSize");
    if (!bVar4) {
LAB_007ce324:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  this->modFunctionIndex = data._36_4_;
  if (0 < this->count) {
    piVar10 = &dst->next;
    lVar9 = 0;
    do {
      hVar6 = PrimePolicy::ModPrime
                        (((WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
                           *)(piVar10 + -1))->hash,prime,this->modFunctionIndex);
      *piVar10 = __s[hVar6];
      __s[hVar6] = (int)lVar9;
      lVar9 = lVar9 + 1;
      piVar10 = piVar10 + 6;
    } while (lVar9 < this->count);
  }
  Memory::Recycler::WBSetBit((char *)&this->buckets);
  (this->buckets).ptr = __s;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
  this->size = prime;
  Memory::Recycler::WBSetBit((char *)&this->entries);
  (this->entries).ptr = dst;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
  return;
}

Assistant:

void Resize()
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int newSize = PrimePolicy::GetSize(count * 2, &modIndex);

            if (newSize <= count)
            {
                // throw OOM if we can't increase the dictionary size
                Js::Throw::OutOfMemory();
            }

            int* newBuckets = RecyclerNewArrayLeaf(recycler, int, newSize);
            for (int i = 0; i < newSize; i++) newBuckets[i] = -1;
            EntryType* newEntries = RecyclerNewArray(recycler, EntryType, newSize);
            CopyArray<EntryType, Field(const RecyclerWeakReference<TKey>*)>(newEntries, newSize, entries, count);
            AnalysisAssert(count < newSize);
            modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                uint bucket = PrimePolicy::GetBucket(newEntries[i].hash, newSize, modFunctionIndex);
                newEntries[i].next = newBuckets[bucket];
                newBuckets[bucket] = i;
            }
            buckets = newBuckets;
            size = newSize;
            entries = newEntries;
        }